

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::SatdLpTest_DISABLED_Speed_Test::TestBody
          (SatdLpTest_DISABLED_Speed_Test *this)

{
  SatdTestBase<short,_int_(*)(const_short_*,_int)> *in_RDI;
  SatdTestBase<short,_int_(*)(const_short_*,_int)> *in_stack_00000090;
  
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::FillRandom(in_RDI);
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::RunSpeedTest(in_stack_00000090);
  return;
}

Assistant:

TEST_P(SatdLpTest, DISABLED_Speed) {
  FillRandom();
  RunSpeedTest();
}